

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int RunTool(int argCount,char **argValues)

{
  int iVar1;
  iterator iVar2;
  ostream *poVar3;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__comp;
  void *__buf;
  int i;
  uint uVar4;
  long lVar5;
  char *pcVar6;
  int i_1;
  ulong uVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator<char> local_26c;
  allocator<char> local_26b;
  allocator_type local_26a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_269;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_268;
  string command;
  string local_240;
  string gdsFName;
  string outFName;
  string foo;
  gdscpp gdsfile;
  string local_f8 [32];
  string local_d8;
  string local_b8;
  string local_98;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  validCommands;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_268 = (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)argValues;
  welcomeScreen();
  if (argCount < 2) {
    return 0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gdsfile,"-g",(allocator<char> *)&outFName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gdsfile.STR_Lookup,"-i",(allocator<char> *)&gdsFName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gdsfile.STR_Lookup._M_h._M_rehash_policy,"-r",(allocator<char> *)&command);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &gdsfile.last_modified.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish,"-rw",(allocator<char> *)&foo);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)gdsfile.library_name.field_2._M_local_buf,"-rs",(allocator<char> *)&local_240
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &gdsfile.GDSfileName.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"-v",&local_26c);
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"-h",&local_26b);
  __comp = &local_269;
  __l._M_len = 7;
  __l._M_array = (iterator)&gdsfile;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&validCommands,__l,__comp,&local_26a);
  lVar5 = 0xc0;
  do {
    std::__cxx11::string::~string((string *)((long)gdsfile.units + lVar5 + -0x10));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&outFName,"",(allocator<char> *)&gdsfile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gdsFName,"",(allocator<char> *)&gdsfile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&command,"",(allocator<char> *)&gdsfile);
  foo._M_dataplus._M_p = (pointer)&foo.field_2;
  foo._M_string_length = 0;
  foo.field_2._M_local_buf[0] = '\0';
  for (uVar7 = 0; (uint)argCount != uVar7; uVar7 = uVar7 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gdsfile,*(char **)(local_268 + uVar7 * 8),(allocator<char> *)&local_240);
    std::__cxx11::string::operator=((string *)&foo,(string *)&gdsfile);
    std::__cxx11::string::~string((string *)&gdsfile);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&validCommands._M_t,&foo);
    __comp = (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&validCommands._M_t._M_impl.super__Rb_tree_header;
    if (iVar2._M_node != (_Base_ptr)__comp) {
      std::__cxx11::string::_M_assign((string *)&command);
    }
  }
  iVar1 = std::__cxx11::string::compare((char *)&command);
  if (iVar1 == 0) {
    pcVar6 = "Invalid.";
LAB_00103d6d:
    poVar3 = std::operator<<((ostream *)&std::cout,pcVar6);
    iVar1 = 0;
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    for (uVar4 = 0; (int)uVar4 < argCount; uVar4 = uVar4 + 1) {
      __comp = local_268;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&gdsfile,*(char **)(local_268 + (ulong)uVar4 * 8),
                 (allocator<char> *)&local_240);
      std::__cxx11::string::operator=((string *)&foo,(string *)&gdsfile);
      std::__cxx11::string::~string((string *)&gdsfile);
      lVar5 = std::__cxx11::string::find((char *)&foo,0x112073);
      if ((lVar5 != -1) || (lVar5 = std::__cxx11::string::find((char *)&foo,0x112050), lVar5 != -1))
      {
        std::__cxx11::string::_M_assign((string *)&gdsFName);
        uVar4 = argCount;
      }
    }
    for (uVar7 = 0; argCount - 1 != uVar7; uVar7 = uVar7 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&gdsfile,*(char **)(local_268 + uVar7 * 8),(allocator<char> *)&local_240)
      ;
      iVar1 = std::__cxx11::string::compare((char *)&gdsfile);
      std::__cxx11::string::~string((string *)&gdsfile);
      if (iVar1 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&gdsfile,*(char **)(local_268 + uVar7 * 8 + 8),
                   (allocator<char> *)&local_240);
        std::__cxx11::string::operator=((string *)&outFName,(string *)&gdsfile);
        std::__cxx11::string::~string((string *)&gdsfile);
      }
    }
    iVar1 = std::__cxx11::string::compare((char *)&outFName);
    if ((iVar1 == 0) && (iVar1 = std::__cxx11::string::compare((char *)&command), iVar1 == 0)) {
      std::__cxx11::string::assign((char *)&outFName);
    }
    iVar1 = std::__cxx11::string::compare((char *)&command);
    if (iVar1 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&gdsfile,"example1.gds",(allocator<char> *)&local_240);
      example1((string *)&gdsfile);
      std::__cxx11::string::~string((string *)&gdsfile);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&gdsfile,"example1.gds",&local_26c);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_240,"example2.gds",&local_26b);
      example2((string *)&gdsfile,&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&gdsfile);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)&command);
      if (iVar1 == 0) {
        iVar1 = std::__cxx11::string::compare((char *)&gdsFName);
        if (iVar1 == 0) goto LAB_00103d66;
        gdsToText(&gdsFName);
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&command);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)&command);
          if (iVar1 == 0) {
            iVar1 = std::__cxx11::string::compare((char *)&gdsFName);
            if (iVar1 != 0) {
              gdscpp::gdscpp(&gdsfile);
              std::__cxx11::string::string((string *)&local_b8,(string *)&gdsFName);
              gdscpp::import(&gdsfile,&local_b8);
              std::__cxx11::string::~string((string *)&local_b8);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_240,"diagram.jpg",&local_26c);
              gdscpp::genDot(&gdsfile,&local_240);
              std::__cxx11::string::~string((string *)&local_240);
              goto LAB_00103d11;
            }
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)&command);
            if (iVar1 != 0) {
              iVar1 = std::__cxx11::string::compare((char *)&command);
              if (iVar1 == 0) {
                if (argCount != 2) goto LAB_00103d66;
                *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 2;
                std::operator<<((ostream *)&std::cout,"Version: ");
                poVar3 = std::ostream::_M_insert<double>(0.9);
                std::endl<char,std::char_traits<char>>(poVar3);
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)&command);
                if (iVar1 != 0) {
                  pcVar6 = "Quickly catch the smoke before it escapes.";
                  goto LAB_00103d6d;
                }
                helpScreen();
              }
              goto LAB_00103d1e;
            }
            iVar1 = std::__cxx11::string::compare((char *)&gdsFName);
            if (iVar1 != 0) {
              gdscpp::gdscpp(&gdsfile);
              std::__cxx11::string::string((string *)&local_d8,(string *)&gdsFName);
              gdscpp::import(&gdsfile,&local_d8);
              std::__cxx11::string::~string((string *)&local_d8);
              gdscpp::findRootSTR((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
                                  &gdsfile);
              std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                        (&local_48);
              goto LAB_00103d11;
            }
          }
LAB_00103d66:
          pcVar6 = "Input argument error.";
          goto LAB_00103d6d;
        }
        iVar1 = std::__cxx11::string::compare((char *)&gdsFName);
        pcVar6 = "Input argument error.";
        if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)&outFName), iVar1 == 0))
        goto LAB_00103d6d;
        gdscpp::gdscpp(&gdsfile);
        std::__cxx11::string::string((string *)&local_98,(string *)&gdsFName);
        gdscpp::import(&gdsfile,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        gdscpp::write(&gdsfile,(int)&outFName,__buf,(size_t)__comp);
LAB_00103d11:
        gdscpp::~gdscpp(&gdsfile);
      }
    }
LAB_00103d1e:
    iVar1 = 1;
  }
  std::__cxx11::string::~string((string *)&foo);
  std::__cxx11::string::~string((string *)&command);
  std::__cxx11::string::~string((string *)&gdsFName);
  std::__cxx11::string::~string((string *)&outFName);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&validCommands._M_t);
  return iVar1;
}

Assistant:

int RunTool(int argCount, char **argValues)
{
  welcomeScreen();

  if (argCount <= 1) {
    return 0;
  }

  set<string> validCommands = {"-g", "-i", "-r", "-rw", "-rs", "-v", "-h"};

  string outFName =
      "\0"; // The output file, which is follow by the -o parameter
  string gdsFName = "\0"; // The GDS/GDS2 file
  string command = "\0";  // The command to be executed

  string foo;

  // search for command
  for (int i = 0; i < argCount; i++) {
    foo = string(argValues[i]);
    if (validCommands.find(foo) != validCommands.end()) {
      command = foo;
    }
  }
  if (!command.compare("\0")) {
    cout << "Invalid." << endl;
    return 0;
  }

  // search for gds/gsd2
  for (int i = 0; i < argCount; i++) {
    foo = string(argValues[i]);
    if (foo.find(".gds") != string::npos || foo.find(".gds2") != string::npos) {
      gdsFName = foo;
      i=argCount;
    }
  }

  // search for output filename
  for (int i = 0; i < argCount - 1; i++) {
    if (!string(argValues[i]).compare("-o")) {
      outFName = string(argValues[i + 1]);
    }
  }
  // auto assign output filename if non has been set
  if (!outFName.compare("\0")) {
    if (!command.compare("-g")) {
      outFName = outfileName;
    }
  }

  // Run the commands
  if (!command.compare("-g")) {
    // if (outFName.compare("\0")) {
    example1("example1.gds");
    example2("example1.gds", "example2.gds");
    return 1;
    // } else {
    //   cout << "Input argument error." << endl;
    //   return 0;
    // }
  } else if (!command.compare("-i")) {
    if (gdsFName.compare("\0")) {
      gdsToText(gdsFName);
      return 1;
    } else {
      cout << "Input argument error." << endl;
      return 0;
    }
  } else if (!command.compare("-rw")) {
    if (gdsFName.compare("\0") && outFName.compare("\0")) {
      gdscpp gdsfile;
      gdsfile.import(gdsFName);
      gdsfile.write(outFName);
      return 1;
    } else {
      cout << "Input argument error." << endl;
      return 0;
    }
  } else if (!command.compare("-r")) {
    if (gdsFName.compare("\0")) {
      gdscpp gdsfile;
      gdsfile.import(gdsFName);
      // gdsfile.createHierarchy();
      gdsfile.genDot("diagram.jpg");
      return 1;
    } else {
      cout << "Input argument error." << endl;
      return 0;
    }
  } else if (!command.compare("-rs")) {
    if (gdsFName.compare("\0")) {
      gdscpp gdsfile;
      gdsfile.import(gdsFName);
      gdsfile.findRootSTR();
      return 1;
    } else {
      cout << "Input argument error." << endl;
      return 0;
    }
  } else if (!command.compare("-v")) {
    if (argCount == 1 + 1) {
      cout << setprecision(2);
      cout << "Version: " << versionNo << endl;
      return 1;
    }
    cout << "Input argument error." << endl;
    return 0;
  } else if (!command.compare("-h")) {
    helpScreen();
    return 1;
  } else {
    cout << "Quickly catch the smoke before it escapes." << endl;
    return 0;
  }

  cout << "I am smelling smoke." << endl;
  return 0;
}